

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_folded
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key)

{
  ulong uVar1;
  code *pcVar2;
  Location loc;
  csubstr sp;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  undefined3 in_register_00000081;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ro_substr pattern;
  csubstr sp_00;
  basic_substring<const_char> bVar15;
  long local_88;
  basic_substring<const_char> local_68;
  undefined8 local_58;
  csubstr cStack_50;
  csubstr s_local;
  ulong uVar8;
  
  s_local.len = s.len;
  s_local.str = s.str;
  if (CONCAT31(in_register_00000081,explicit_key) != 0) {
    WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])"? ");
  }
  pattern.len = 1;
  pattern.str = "\r";
  sVar5 = basic_substring<const_char>::find(&s_local,pattern,0);
  if (sVar5 != 0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    cStack_50 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    local_68.str = (char *)0x0;
    local_68.len = 0x5a93;
    local_58 = 0;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x5a93) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x5a93) << 0x40,8);
    loc.name.str = cStack_50.str;
    loc.name.len = cStack_50.len;
    error("check failed: s.find(\"\\r\") == csubstr::npos",0x2b,loc);
  }
  bVar15 = basic_substring<const_char>::trimr(&s_local,'\n');
  uVar12 = bVar15.len;
  pcVar6 = bVar15.str;
  uVar10 = s_local.len - uVar12;
  if (uVar10 == 1) {
    WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])0x1df01e);
  }
  else {
    if (uVar10 == 0) {
      pcVar11 = ">-\n";
    }
    else {
      pcVar11 = ">+\n";
    }
    WriterOStream<std::__cxx11::stringstream>::_do_write<4ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [4])pcVar11);
  }
  if (uVar12 != 0) {
    lVar14 = ilevel + 1;
    uVar7 = 0;
    uVar8 = 0;
    while (uVar12 != uVar7) {
      uVar1 = uVar7 + 1;
      pcVar11 = pcVar6 + uVar7;
      uVar7 = uVar1;
      if (*pcVar11 == '\n') {
        if (uVar12 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar9 = uVar1;
        if (uVar1 == 0xffffffffffffffff) {
          uVar9 = uVar12;
        }
        if (uVar9 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar12 < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_68,pcVar6 + uVar8,uVar9 - uVar8);
        sVar5 = local_68.len;
        pcVar11 = local_68.str;
        lVar13 = lVar14;
        while (bVar3 = lVar13 != 0, lVar13 = lVar13 + -1, bVar3) {
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,' ');
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,' ');
        }
        sp_00.len = sVar5;
        sp_00.str = pcVar11;
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,sp_00);
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,'\n');
        uVar8 = uVar1;
      }
    }
    if (uVar8 <= uVar12 && uVar12 - uVar8 != 0) {
      while (bVar3 = lVar14 != 0, lVar14 = lVar14 + -1, bVar3) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
      }
      basic_substring<const_char>::basic_substring(&local_68,pcVar6 + uVar8,uVar12 - uVar8);
      sp.len = local_68.len;
      sp.str = local_68.str;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,sp);
    }
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'\n');
      uVar10 = uVar10 - 1;
    }
  }
  local_88 = ilevel + 1;
  uVar12 = 0;
  while (lVar14 = local_88, uVar12 != uVar10) {
    while (bVar3 = lVar14 != 0, lVar14 = lVar14 + -1, bVar3) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    uVar12 = uVar12 + 1;
    if (uVar12 < uVar10 || explicit_key) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'\n');
    }
  }
  if (explicit_key && uVar10 == 0) {
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\n');
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_folded(csubstr s, size_t ilevel, bool explicit_key)
{
    if(explicit_key)
    {
        this->Writer::_do_write("? ");
    }
    RYML_ASSERT(s.find("\r") == csubstr::npos);
    csubstr trimmed = s.trimr('\n');
    size_t numnewlines_at_end = s.len - trimmed.len;
    if(numnewlines_at_end == 0)
    {
        this->Writer::_do_write(">-\n");
    }
    else if(numnewlines_at_end == 1)
    {
        this->Writer::_do_write(">\n");
    }
    else if(numnewlines_at_end > 1)
    {
        this->Writer::_do_write(">+\n");
    }
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            pos = i+1; // because of the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            this->Writer::_do_write('\n'); // write the newline twice
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}